

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidget::QTreeWidget(QTreeWidget *this,QWidget *parent)

{
  long lVar1;
  QTreeWidgetPrivate *this_00;
  QTreeModel *this_01;
  QAbstractItemModel *pQVar2;
  QItemSelectionModel *pQVar3;
  QHeaderView *this_02;
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  Object local_50 [8];
  Object local_48 [8];
  Object local_40 [8];
  Object local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTreeWidgetPrivate *)operator_new(0x6f0);
  QTreeWidgetPrivate::QTreeWidgetPrivate(this_00);
  QTreeView::QTreeView(&this->super_QTreeView,(QTreeViewPrivate *)this_00,parent);
  *(undefined ***)
   &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame.
    super_QWidget = &PTR_metaObject_007ea7b8;
  *(undefined ***)
   &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame.
    super_QWidget.super_QPaintDevice = &PTR__QTreeWidget_007eaaf8;
  lVar1 = *(long *)&(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  this_01 = (QTreeModel *)operator_new(0x58);
  QTreeModel::QTreeModel(this_01,1,this);
  QTreeView::setModel(&this->super_QTreeView,(QAbstractItemModel *)this_01);
  type = (ConnectionType)lVar1;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_90,(offset_in_QAbstractItemView_to_subr)this,
             (Object *)QAbstractItemView::pressed,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_90 + 8),(offset_in_QAbstractItemView_to_subr)this,
             (Object *)QAbstractItemView::clicked,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_80,(offset_in_QAbstractItemView_to_subr)this,
             (Object *)QAbstractItemView::doubleClicked,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_80 + 8),(offset_in_QAbstractItemView_to_subr)this,
             (Object *)QAbstractItemView::activated,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_70,(offset_in_QAbstractItemView_to_subr)this,
             (Object *)QAbstractItemView::entered,0,type);
  QObjectPrivate::
  connect<void(QTreeView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_70 + 8),(offset_in_QTreeView_to_subr)this,
             (Object *)QTreeView::expanded,0,type);
  QObjectPrivate::
  connect<void(QTreeView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_60,(offset_in_QTreeView_to_subr)this,(Object *)QTreeView::collapsed,0,
             type);
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_60 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar2,
             (Object *)QAbstractItemModel::dataChanged,0,type);
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (local_50,(offset_in_QAbstractItemModel_to_subr)pQVar2,
             (Object *)QAbstractItemModel::dataChanged,0,type);
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QTreeWidgetPrivate::*)()>
            (local_48,(offset_in_QAbstractItemModel_to_subr)pQVar2,
             (Object *)QAbstractItemModel::columnsRemoved,0,type);
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  QObjectPrivate::
  connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (local_40,(offset_in_QItemSelectionModel_to_subr)pQVar3,
             (Object *)QItemSelectionModel::currentChanged,0,type);
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  QObjectPrivate::
  connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QTreeWidgetPrivate::*)(QItemSelection_const&,QItemSelection_const&)>
            (local_38,(offset_in_QItemSelectionModel_to_subr)pQVar3,
             (Object *)QItemSelectionModel::selectionChanged,0,type);
  std::array<QMetaObject::Connection,_12UL>::operator=
            ((array<QMetaObject::Connection,_12UL> *)(lVar1 + 0x688),
             (array<QMetaObject::Connection,_12UL> *)local_90);
  std::array<QMetaObject::Connection,_12UL>::~array
            ((array<QMetaObject::Connection,_12UL> *)local_90);
  this_02 = QTreeView::header(&this->super_QTreeView);
  QHeaderView::setSectionsClickable(this_02,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidget::QTreeWidget(QWidget *parent)
    : QTreeView(*new QTreeWidgetPrivate(), parent)
{
    Q_D(QTreeWidget);
    QTreeView::setModel(new QTreeModel(1, this));
    d->connections = {
        QObjectPrivate::connect(this, &QTreeWidget::pressed,
                                d, &QTreeWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(this, &QTreeWidget::clicked,
                                d, &QTreeWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(this, &QTreeWidget::doubleClicked,
                                d, &QTreeWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(this, &QTreeWidget::activated,
                                d, &QTreeWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(this, &QTreeWidget::entered,
                                d, &QTreeWidgetPrivate::emitItemEntered),
        QObjectPrivate::connect(this, &QTreeWidget::expanded,
                                d, &QTreeWidgetPrivate::emitItemExpanded),
        QObjectPrivate::connect(this, &QTreeWidget::collapsed,
                                d, &QTreeWidgetPrivate::emitItemCollapsed),
        QObjectPrivate::connect(model(), &QAbstractItemModel::dataChanged,
                                d, &QTreeWidgetPrivate::emitItemChanged),
        QObjectPrivate::connect(model(), &QAbstractItemModel::dataChanged,
                                d, &QTreeWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model(), &QAbstractItemModel::columnsRemoved,
                                d, &QTreeWidgetPrivate::sort),
        QObjectPrivate::connect(selectionModel(), &QItemSelectionModel::currentChanged,
                                d, &QTreeWidgetPrivate::emitCurrentItemChanged),
        QObjectPrivate::connect(selectionModel(), &QItemSelectionModel::selectionChanged,
                                d, &QTreeWidgetPrivate::selectionChanged)
    };
    header()->setSectionsClickable(false);
}